

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O3

void ft_smooth_lcd_spans(int y,int count,FT_Span *spans,TOrigin *target)

{
  uchar uVar1;
  ushort uVar2;
  int iVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uchar *puVar33;
  long lVar34;
  ulong uVar35;
  undefined1 in_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar59;
  int iVar60;
  undefined1 auVar57 [16];
  int iVar61;
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  int iVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  
  auVar32 = _DAT_003064c0;
  auVar31 = _DAT_003064b0;
  auVar30 = _DAT_003064a0;
  auVar29 = _DAT_00306490;
  auVar28 = _DAT_00306480;
  auVar27 = _DAT_002f57d0;
  auVar26 = _DAT_002ef930;
  if (count != 0) {
    puVar4 = target->origin;
    iVar3 = target->pitch;
    do {
      uVar2 = spans->len;
      if ((ulong)uVar2 != 0) {
        puVar33 = puVar4 + ((long)spans->x * 3 - (long)(y * iVar3));
        uVar1 = spans->coverage;
        lVar34 = (ulong)uVar2 - 1;
        auVar53._8_4_ = (int)lVar34;
        auVar53._0_8_ = lVar34;
        auVar53._12_4_ = (int)((ulong)lVar34 >> 0x20);
        uVar35 = 0;
        do {
          auVar54._8_4_ = (int)uVar35;
          auVar54._0_8_ = uVar35;
          auVar54._12_4_ = (int)(uVar35 >> 0x20);
          auVar57 = auVar53 ^ auVar26;
          auVar62 = (auVar54 | auVar27) ^ auVar26;
          iVar56 = auVar57._0_4_;
          iVar75 = -(uint)(iVar56 < auVar62._0_4_);
          iVar59 = auVar57._4_4_;
          auVar64._4_4_ = -(uint)(iVar59 < auVar62._4_4_);
          iVar60 = auVar57._8_4_;
          iVar79 = -(uint)(iVar60 < auVar62._8_4_);
          iVar61 = auVar57._12_4_;
          auVar64._12_4_ = -(uint)(iVar61 < auVar62._12_4_);
          auVar36._4_4_ = iVar75;
          auVar36._0_4_ = iVar75;
          auVar36._8_4_ = iVar79;
          auVar36._12_4_ = iVar79;
          auVar36 = pshuflw(in_XMM0,auVar36,0xe8);
          auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar59);
          auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar61);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar45 = pshuflw(in_XMM1,auVar63,0xe8);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar62 = pshuflw(auVar36,auVar64,0xe8);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar62 | auVar45 & auVar36) ^ auVar57;
          auVar57 = packssdw(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *puVar33 = uVar1;
          }
          auVar45._4_4_ = iVar75;
          auVar45._0_4_ = iVar75;
          auVar45._8_4_ = iVar79;
          auVar45._12_4_ = iVar79;
          auVar64 = auVar63 & auVar45 | auVar64;
          auVar57 = packssdw(auVar64,auVar64);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar62,auVar57 ^ auVar62);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 8 & 1) != 0) {
            puVar33[3] = uVar1;
          }
          auVar57 = (auVar54 | auVar32) ^ auVar26;
          auVar46._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar46._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar46._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar46._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar65._4_4_ = auVar46._0_4_;
          auVar65._0_4_ = auVar46._0_4_;
          auVar65._8_4_ = auVar46._8_4_;
          auVar65._12_4_ = auVar46._8_4_;
          iVar75 = -(uint)(auVar57._4_4_ == iVar59);
          iVar79 = -(uint)(auVar57._12_4_ == iVar61);
          auVar14._4_4_ = iVar75;
          auVar14._0_4_ = iVar75;
          auVar14._8_4_ = iVar79;
          auVar14._12_4_ = iVar79;
          auVar76._4_4_ = auVar46._4_4_;
          auVar76._0_4_ = auVar46._4_4_;
          auVar76._8_4_ = auVar46._12_4_;
          auVar76._12_4_ = auVar46._12_4_;
          auVar57 = auVar14 & auVar65 | auVar76;
          auVar57 = packssdw(auVar57,auVar57);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar5,auVar57 ^ auVar5);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
            puVar33[6] = uVar1;
          }
          auVar57 = pshufhw(auVar57,auVar65,0x84);
          auVar15._4_4_ = iVar75;
          auVar15._0_4_ = iVar75;
          auVar15._8_4_ = iVar79;
          auVar15._12_4_ = iVar79;
          auVar62 = pshufhw(auVar46,auVar15,0x84);
          auVar36 = pshufhw(auVar57,auVar76,0x84);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar37 = (auVar36 | auVar62 & auVar57) ^ auVar37;
          auVar57 = packssdw(auVar37,auVar37);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
            puVar33[9] = uVar1;
          }
          auVar57 = (auVar54 | auVar31) ^ auVar26;
          auVar47._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar47._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar47._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar47._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar16._4_4_ = auVar47._0_4_;
          auVar16._0_4_ = auVar47._0_4_;
          auVar16._8_4_ = auVar47._8_4_;
          auVar16._12_4_ = auVar47._8_4_;
          auVar62 = pshuflw(auVar76,auVar16,0xe8);
          auVar38._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
          auVar38._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
          auVar38._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
          auVar38._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
          auVar66._4_4_ = auVar38._4_4_;
          auVar66._0_4_ = auVar38._4_4_;
          auVar66._8_4_ = auVar38._12_4_;
          auVar66._12_4_ = auVar38._12_4_;
          auVar57 = pshuflw(auVar38,auVar66,0xe8);
          auVar67._4_4_ = auVar47._4_4_;
          auVar67._0_4_ = auVar47._4_4_;
          auVar67._8_4_ = auVar47._12_4_;
          auVar67._12_4_ = auVar47._12_4_;
          auVar36 = pshuflw(auVar47,auVar67,0xe8);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 & auVar62,(auVar36 | auVar57 & auVar62) ^ auVar6);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar33[0xc] = uVar1;
          }
          auVar17._4_4_ = auVar47._0_4_;
          auVar17._0_4_ = auVar47._0_4_;
          auVar17._8_4_ = auVar47._8_4_;
          auVar17._12_4_ = auVar47._8_4_;
          auVar67 = auVar66 & auVar17 | auVar67;
          auVar36 = packssdw(auVar67,auVar67);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57,auVar36 ^ auVar7);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._4_2_ >> 8 & 1) != 0) {
            puVar33[0xf] = uVar1;
          }
          auVar57 = (auVar54 | auVar30) ^ auVar26;
          auVar48._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar48._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar48._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar48._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar68._4_4_ = auVar48._0_4_;
          auVar68._0_4_ = auVar48._0_4_;
          auVar68._8_4_ = auVar48._8_4_;
          auVar68._12_4_ = auVar48._8_4_;
          iVar75 = -(uint)(auVar57._4_4_ == iVar59);
          iVar79 = -(uint)(auVar57._12_4_ == iVar61);
          auVar18._4_4_ = iVar75;
          auVar18._0_4_ = iVar75;
          auVar18._8_4_ = iVar79;
          auVar18._12_4_ = iVar79;
          auVar77._4_4_ = auVar48._4_4_;
          auVar77._0_4_ = auVar48._4_4_;
          auVar77._8_4_ = auVar48._12_4_;
          auVar77._12_4_ = auVar48._12_4_;
          auVar57 = auVar18 & auVar68 | auVar77;
          auVar57 = packssdw(auVar57,auVar57);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar8,auVar57 ^ auVar8);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar33[0x12] = uVar1;
          }
          auVar57 = pshufhw(auVar57,auVar68,0x84);
          auVar19._4_4_ = iVar75;
          auVar19._0_4_ = iVar75;
          auVar19._8_4_ = iVar79;
          auVar19._12_4_ = iVar79;
          auVar62 = pshufhw(auVar48,auVar19,0x84);
          auVar36 = pshufhw(auVar57,auVar77,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar36 | auVar62 & auVar57) ^ auVar39;
          auVar57 = packssdw(auVar39,auVar39);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._6_2_ >> 8 & 1) != 0) {
            puVar33[0x15] = uVar1;
          }
          auVar57 = (auVar54 | auVar29) ^ auVar26;
          auVar49._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar49._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar49._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar49._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar20._4_4_ = auVar49._0_4_;
          auVar20._0_4_ = auVar49._0_4_;
          auVar20._8_4_ = auVar49._8_4_;
          auVar20._12_4_ = auVar49._8_4_;
          auVar62 = pshuflw(auVar77,auVar20,0xe8);
          auVar40._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
          auVar40._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
          auVar40._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
          auVar40._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
          auVar69._4_4_ = auVar40._4_4_;
          auVar69._0_4_ = auVar40._4_4_;
          auVar69._8_4_ = auVar40._12_4_;
          auVar69._12_4_ = auVar40._12_4_;
          auVar57 = pshuflw(auVar40,auVar69,0xe8);
          auVar70._4_4_ = auVar49._4_4_;
          auVar70._0_4_ = auVar49._4_4_;
          auVar70._8_4_ = auVar49._12_4_;
          auVar70._12_4_ = auVar49._12_4_;
          auVar36 = pshuflw(auVar49,auVar70,0xe8);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar36 | auVar57 & auVar62) ^ auVar50;
          auVar36 = packssdw(auVar50,auVar50);
          auVar57 = packsswb(auVar57 & auVar62,auVar36);
          if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar33[0x18] = uVar1;
          }
          auVar21._4_4_ = auVar49._0_4_;
          auVar21._0_4_ = auVar49._0_4_;
          auVar21._8_4_ = auVar49._8_4_;
          auVar21._12_4_ = auVar49._8_4_;
          auVar70 = auVar69 & auVar21 | auVar70;
          auVar36 = packssdw(auVar70,auVar70);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar36 = packssdw(auVar36 ^ auVar9,auVar36 ^ auVar9);
          auVar57 = packsswb(auVar57,auVar36);
          if ((auVar57._8_2_ >> 8 & 1) != 0) {
            puVar33[0x1b] = uVar1;
          }
          auVar57 = (auVar54 | auVar28) ^ auVar26;
          auVar51._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar51._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar51._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar51._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar71._4_4_ = auVar51._0_4_;
          auVar71._0_4_ = auVar51._0_4_;
          auVar71._8_4_ = auVar51._8_4_;
          auVar71._12_4_ = auVar51._8_4_;
          iVar75 = -(uint)(auVar57._4_4_ == iVar59);
          iVar79 = -(uint)(auVar57._12_4_ == iVar61);
          auVar22._4_4_ = iVar75;
          auVar22._0_4_ = iVar75;
          auVar22._8_4_ = iVar79;
          auVar22._12_4_ = iVar79;
          auVar78._4_4_ = auVar51._4_4_;
          auVar78._0_4_ = auVar51._4_4_;
          auVar78._8_4_ = auVar51._12_4_;
          auVar78._12_4_ = auVar51._12_4_;
          auVar57 = auVar22 & auVar71 | auVar78;
          auVar57 = packssdw(auVar57,auVar57);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar10,auVar57 ^ auVar10);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar33[0x1e] = uVar1;
          }
          auVar57 = pshufhw(auVar57,auVar71,0x84);
          auVar23._4_4_ = iVar75;
          auVar23._0_4_ = iVar75;
          auVar23._8_4_ = iVar79;
          auVar23._12_4_ = iVar79;
          auVar62 = pshufhw(auVar51,auVar23,0x84);
          auVar36 = pshufhw(auVar57,auVar78,0x84);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar36 | auVar62 & auVar57) ^ auVar41;
          auVar57 = packssdw(auVar41,auVar41);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._10_2_ >> 8 & 1) != 0) {
            puVar33[0x21] = uVar1;
          }
          auVar57 = (auVar54 | _DAT_00306470) ^ auVar26;
          auVar52._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar52._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar52._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar52._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar24._4_4_ = auVar52._0_4_;
          auVar24._0_4_ = auVar52._0_4_;
          auVar24._8_4_ = auVar52._8_4_;
          auVar24._12_4_ = auVar52._8_4_;
          auVar62 = pshuflw(auVar78,auVar24,0xe8);
          auVar42._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
          auVar42._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
          auVar42._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
          auVar42._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
          auVar72._4_4_ = auVar42._4_4_;
          auVar72._0_4_ = auVar42._4_4_;
          auVar72._8_4_ = auVar42._12_4_;
          auVar72._12_4_ = auVar42._12_4_;
          auVar57 = pshuflw(auVar42,auVar72,0xe8);
          auVar73._4_4_ = auVar52._4_4_;
          auVar73._0_4_ = auVar52._4_4_;
          auVar73._8_4_ = auVar52._12_4_;
          auVar73._12_4_ = auVar52._12_4_;
          auVar36 = pshuflw(auVar52,auVar73,0xe8);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 & auVar62,(auVar36 | auVar57 & auVar62) ^ auVar11);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar33[0x24] = uVar1;
          }
          auVar25._4_4_ = auVar52._0_4_;
          auVar25._0_4_ = auVar52._0_4_;
          auVar25._8_4_ = auVar52._8_4_;
          auVar25._12_4_ = auVar52._8_4_;
          auVar73 = auVar72 & auVar25 | auVar73;
          auVar36 = packssdw(auVar73,auVar73);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57,auVar36 ^ auVar12);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._12_2_ >> 8 & 1) != 0) {
            puVar33[0x27] = uVar1;
          }
          auVar57 = (auVar54 | _DAT_00306460) ^ auVar26;
          auVar43._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
          auVar43._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
          auVar43._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
          auVar43._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
          auVar74._4_4_ = auVar43._0_4_;
          auVar74._0_4_ = auVar43._0_4_;
          auVar74._8_4_ = auVar43._8_4_;
          auVar74._12_4_ = auVar43._8_4_;
          auVar55._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
          auVar55._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar58._4_4_ = auVar43._4_4_;
          auVar58._0_4_ = auVar43._4_4_;
          auVar58._8_4_ = auVar43._12_4_;
          auVar58._12_4_ = auVar43._12_4_;
          auVar36 = auVar55 & auVar74 | auVar58;
          auVar57 = packssdw(auVar43,auVar36);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar13,auVar57 ^ auVar13);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar33[0x2a] = uVar1;
          }
          auVar57 = pshufhw(auVar57,auVar74,0x84);
          auVar36 = pshufhw(auVar36,auVar55,0x84);
          in_XMM1 = auVar36 & auVar57;
          auVar57 = pshufhw(auVar57,auVar58,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar57 | in_XMM1) ^ auVar44;
          auVar57 = packssdw(auVar44,auVar44);
          in_XMM0 = packsswb(auVar57,auVar57);
          if ((in_XMM0._14_2_ >> 8 & 1) != 0) {
            puVar33[0x2d] = uVar1;
          }
          uVar35 = uVar35 + 0x10;
          puVar33 = puVar33 + 0x30;
        } while ((uVar2 + 0xf & 0xfffffff0) != uVar35);
      }
      count = count + -1;
      spans = spans + 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void
  ft_smooth_lcd_spans( int             y,
                       int             count,
                       const FT_Span*  spans,
                       TOrigin*        target )
  {
    unsigned char*  dst_line = target->origin - y * target->pitch;
    unsigned char*  dst;
    unsigned short  w;


    for ( ; count--; spans++ )
      for ( dst = dst_line + spans->x * 3, w = spans->len; w--; dst += 3 )
        *dst = spans->coverage;
  }